

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_ble_16(void)

{
  uint uVar1;
  
  if (((char)((byte)m68ki_cpu.v_flag ^ (byte)m68ki_cpu.n_flag) < '\0') ||
     (m68ki_cpu.not_z_flag == 0)) {
    uVar1 = m68ki_read_imm_16();
    m68ki_cpu.pc = ((int)(short)uVar1 + m68ki_cpu.pc) - 2;
  }
  else {
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_bcc_notake_w;
  }
  return;
}

Assistant:

static void m68k_op_ble_16(void)
{
	if(COND_LE())
	{
		uint offset = OPER_I_16();
		REG_PC -= 2;
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_branch_16(offset);
		return;
	}
	REG_PC += 2;
	USE_CYCLES(CYC_BCC_NOTAKE_W);
}